

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreply.cpp
# Opt level: O2

void QNetworkReply::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  InterfaceType *pIVar3;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c != IndexOfMethod) {
      if (_c != InvokeMetaMethod) {
        return;
      }
      switch(_id) {
      case 0:
        socketStartedConnecting((QNetworkReply *)_o);
        return;
      case 1:
        requestSent((QNetworkReply *)_o);
        return;
      case 2:
        metaDataChanged((QNetworkReply *)_o);
        return;
      case 3:
        finished((QNetworkReply *)_o);
        return;
      case 4:
        errorOccurred((QNetworkReply *)_o,*_a[1]);
        return;
      case 5:
        encrypted((QNetworkReply *)_o);
        return;
      case 6:
        sslErrors((QNetworkReply *)_o,(QList<QSslError> *)_a[1]);
        return;
      case 7:
        preSharedKeyAuthenticationRequired((QNetworkReply *)_o,*_a[1]);
        return;
      case 8:
        redirected((QNetworkReply *)_o,(QUrl *)_a[1]);
        return;
      case 9:
        redirectAllowed((QNetworkReply *)_o);
        return;
      case 10:
        uploadProgress((QNetworkReply *)_o,*_a[1],*_a[2]);
        return;
      case 0xb:
        downloadProgress((QNetworkReply *)_o,*_a[1],*_a[2]);
        return;
      case 0xc:
        (**(code **)(*(long *)_o + 0xf0))();
        return;
      case 0xd:
        (**(code **)(*(long *)_o + 0xf8))();
        return;
      default:
        return;
      }
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                      ((QtMocHelpers *)_a,(void **)socketStartedConnecting,0,0);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                      ((QtMocHelpers *)_a,(void **)requestSent,0,1);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                      ((QtMocHelpers *)_a,(void **)metaDataChanged,0,2);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                      ((QtMocHelpers *)_a,(void **)finished,0,3);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(QNetworkReply::NetworkError)>
                      ((QtMocHelpers *)_a,(void **)errorOccurred,0,4);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                      ((QtMocHelpers *)_a,(void **)encrypted,0,5);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(QList<QSslError>const&)>
                      ((QtMocHelpers *)_a,(void **)sslErrors,0,6);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(QSslPreSharedKeyAuthenticator*)>
                      ((QtMocHelpers *)_a,(void **)preSharedKeyAuthenticationRequired,0,7);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(QUrl_const&)>
                      ((QtMocHelpers *)_a,(void **)redirected,0,8);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                      ((QtMocHelpers *)_a,(void **)redirectAllowed,0,9);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(long_long,long_long)>
                      ((QtMocHelpers *)_a,(void **)uploadProgress,0,10);
    if (bVar1) {
      return;
    }
    QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(long_long,long_long)>
              ((QtMocHelpers *)_a,(void **)downloadProgress,0,0xb);
    return;
  }
  if (_id == 4) {
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
LAB_0018cad6:
      *puVar2 = pIVar3;
      return;
    }
  }
  else if (_id == 6) {
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
      goto LAB_0018cad6;
    }
  }
  else if (_id == 7) {
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
      goto LAB_0018cad6;
    }
  }
  else {
    puVar2 = (undefined8 *)*_a;
  }
  *puVar2 = 0;
  return;
}

Assistant:

void QNetworkReply::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReply *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->socketStartedConnecting(); break;
        case 1: _t->requestSent(); break;
        case 2: _t->metaDataChanged(); break;
        case 3: _t->finished(); break;
        case 4: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 5: _t->encrypted(); break;
        case 6: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 7: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 8: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 9: _t->redirectAllowed(); break;
        case 10: _t->uploadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 11: _t->downloadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 12: _t->abort(); break;
        case 13: _t->ignoreSslErrors(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::socketStartedConnecting, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::requestSent, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::metaDataChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::finished, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(QNetworkReply::NetworkError )>(_a, &QNetworkReply::errorOccurred, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::encrypted, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(const QList<QSslError> & )>(_a, &QNetworkReply::sslErrors, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QNetworkReply::preSharedKeyAuthenticationRequired, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(const QUrl & )>(_a, &QNetworkReply::redirected, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::redirectAllowed, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(qint64 , qint64 )>(_a, &QNetworkReply::uploadProgress, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(qint64 , qint64 )>(_a, &QNetworkReply::downloadProgress, 11))
            return;
    }
}